

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

DdNode * Llb_Nonlin4SweepPartitions_rec
                   (DdManager *dd,Aig_Obj_t *pObj,Vec_Int_t *vOrder,Vec_Ptr_t *vRoots)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  uint uVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (uVar4 != 2) {
    if (uVar4 == 1) {
      pDVar2 = Cudd_ReadOne(dd);
      return pDVar2;
    }
    pDVar2 = (DdNode *)(pObj->field_5).pData;
    if (pDVar2 == (DdNode *)0x0) {
      pDVar2 = Llb_Nonlin4SweepPartitions_rec
                         (dd,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vOrder,vRoots)
      ;
      pDVar2 = (DdNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pDVar2);
      if (uVar4 == 3) {
        iVar1 = Llb_ObjBddVar(vOrder,pObj);
        pDVar3 = Cudd_bddIthVar(dd,iVar1);
        pDVar2 = Cudd_bddXnor(dd,pDVar3,pDVar2);
        Cudd_Ref(pDVar2);
        Vec_PtrPush(vRoots,pDVar2);
        pDVar2 = (DdNode *)0x0;
      }
      else {
        pDVar3 = Llb_Nonlin4SweepPartitions_rec
                           (dd,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vOrder,
                            vRoots);
        pDVar3 = Cudd_bddAnd(dd,pDVar2,(DdNode *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pDVar3))
        ;
        Cudd_Ref(pDVar3);
        iVar1 = Llb_ObjBddVar(vOrder,pObj);
        pDVar2 = pDVar3;
        if (-1 < iVar1) {
          iVar1 = Llb_ObjBddVar(vOrder,pObj);
          pDVar2 = Cudd_bddIthVar(dd,iVar1);
          n = Cudd_bddXnor(dd,pDVar2,pDVar3);
          Cudd_Ref(n);
          Vec_PtrPush(vRoots,n);
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_Ref(pDVar2);
        }
        (pObj->field_5).pData = pDVar2;
      }
    }
    return pDVar2;
  }
  iVar1 = Llb_ObjBddVar(vOrder,pObj);
  pDVar2 = Cudd_bddIthVar(dd,iVar1);
  return pDVar2;
}

Assistant:

DdNode * Llb_Nonlin4SweepPartitions_rec( DdManager * dd, Aig_Obj_t * pObj, Vec_Int_t * vOrder, Vec_Ptr_t * vRoots )
{
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart, * vVar;
    if ( Aig_ObjIsConst1(pObj) )
        return Cudd_ReadOne(dd); 
    if ( Aig_ObjIsCi(pObj) )
        return Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    if ( pObj->pData )
        return (DdNode *)pObj->pData;
    if ( Aig_ObjIsCo(pObj) )
    {
        bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) ), bBdd0 );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        return NULL;
    }
    bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
    bBdd1 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin1(pObj), vOrder, vRoots), Aig_ObjFaninC1(pObj) );
    bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( bBdd );
    if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
    {
        vVar  = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bPart = Cudd_bddXnor( dd, vVar, bBdd );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        bBdd = vVar;  Cudd_Ref( vVar );
    }
    pObj->pData = bBdd;
    return bBdd;
}